

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app_dummy.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::SetPanId
          (Error *__return_storage_ptr__,CommissionerApp *this,uint16_t aPanId,MilliSeconds aDelay)

{
  uint16_t aPanId_local;
  CommissionerApp *this_local;
  MilliSeconds aDelay_local;
  
  Error::Error(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::SetPanId(uint16_t aPanId, MilliSeconds aDelay)
{
    UNUSED(aPanId);
    UNUSED(aDelay);
    return Error{};
}